

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

int __thiscall google::protobuf::Fls128(protobuf *this,uint128 n)

{
  int iVar1;
  uint64 uVar2;
  uint64 hi;
  uint128 n_local;
  
  n_local.lo_ = n.lo_;
  hi = (uint64)this;
  uVar2 = Uint128High64((uint128 *)&hi);
  if (uVar2 == 0) {
    uVar2 = Uint128Low64((uint128 *)&hi);
    n_local.hi_._4_4_ = Fls64(uVar2);
  }
  else {
    iVar1 = Fls64(uVar2);
    n_local.hi_._4_4_ = iVar1 + 0x40;
  }
  return n_local.hi_._4_4_;
}

Assistant:

static inline int Fls128(uint128 n) {
  if (uint64 hi = Uint128High64(n)) {
    return Fls64(hi) + 64;
  }
  return Fls64(Uint128Low64(n));
}